

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkInit(ARKodeMem ark_mem,sunrealtype t0,N_Vector y0,int init_type)

{
  int in_EDX;
  N_Vector in_RSI;
  ARKodeMem in_RDI;
  sunrealtype in_XMM0_Qa;
  sunindextype liw1;
  sunindextype lrw1;
  int retval;
  int allocOK;
  int nvectorOK;
  int stepperOK;
  ARKodeMem in_stack_ffffffffffffffb8;
  sunindextype local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  N_Vector local_20;
  sunrealtype local_18;
  ARKodeMem local_10;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x64d,"arkInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI == (N_Vector)0x0) {
    arkProcessError(in_RDI,-0x16,0x655,"arkInit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                    ,"y0 = NULL illegal.");
    local_4 = -0x16;
  }
  else {
    local_24 = in_EDX;
    if ((in_EDX == 1) && (in_RDI->initialized == 0)) {
      local_24 = 0;
    }
    local_20 = in_RSI;
    local_18 = in_XMM0_Qa;
    local_10 = in_RDI;
    if (in_RDI->MallocDone == 0) {
      local_28 = arkCheckTimestepper(in_RDI);
      if (local_28 == 0) {
        arkProcessError(local_10,-0x16,0x667,"arkInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"Time stepper module is missing required functionality");
        return -0x16;
      }
      local_2c = arkCheckNvector(local_20);
      if (local_2c == 0) {
        arkProcessError(local_10,-0x16,0x670,"arkInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"A required vector operation is not implemented.");
        return -0x16;
      }
      if (local_20->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        local_40 = 0;
        in_stack_ffffffffffffffb8 = (ARKodeMem)0x0;
      }
      else {
        N_VSpace(local_20,&local_40,&stack0xffffffffffffffb8);
      }
      local_10->lrw1 = local_40;
      local_10->liw1 = (sunindextype)in_stack_ffffffffffffffb8;
      local_30 = arkAllocVectors(in_stack_ffffffffffffffb8,(N_Vector)0x179ac5);
      if (local_30 == 0) {
        arkProcessError(local_10,-0x14,0x683,"arkInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"A memory request failed.");
        return -0x14;
      }
      local_10->MallocDone = 1;
    }
    local_10->tcur = local_18;
    local_10->tn = local_18;
    N_VScale(0x3ff0000000000000,local_20,local_10->yn);
    local_10->fn_is_current = 0;
    local_10->tstopset = 0;
    if (local_24 == 0) {
      local_10->nst_attempts = 0;
      local_10->nst = 0;
      local_10->nhnil = 0;
      local_10->ncfn = 0;
      local_10->netf = 0;
      local_10->nconstrfails = 0;
      local_10->h0u = 0.0;
      local_10->hold = 0.0;
      local_10->next_h = 0.0;
      local_10->tolsf = 1.0;
      local_34 = SUNAdaptController_Reset(local_10->hadapt_mem->hcontroller);
      if (local_34 != 0) {
        arkProcessError(local_10,-0x2f,0x6b0,"arkInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode.c"
                        ,"Unable to reset error controller object");
        return -0x2f;
      }
      local_10->hadapt_mem->nst_acc = 0;
      local_10->hadapt_mem->nst_exp = 0;
      local_10->call_fullrhs = 0;
      local_10->initialized = 0;
    }
    local_10->initsetup = 1;
    local_10->init_type = local_24;
    local_10->firststage = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkInit(ARKodeMem ark_mem, sunrealtype t0, N_Vector y0, int init_type)
{
  sunbooleantype stepperOK, nvectorOK, allocOK;
  int retval;
  sunindextype lrw1, liw1;

  /* Check ark_mem */
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (ARK_ILL_INPUT);
  }

  /* Check if reset was called before the first Evolve call */
  if (init_type == RESET_INIT && !(ark_mem->initialized))
  {
    init_type = FIRST_INIT;
  }

  /* Check if allocations have been done i.e., is this first init call */
  if (ark_mem->MallocDone == SUNFALSE)
  {
    /* Test if all required time stepper operations are implemented */
    stepperOK = arkCheckTimestepper(ark_mem);
    if (!stepperOK)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Time stepper module is missing required functionality");
      return (ARK_ILL_INPUT);
    }

    /* Test if all required vector operations are implemented */
    nvectorOK = arkCheckNvector(y0);
    if (!nvectorOK)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_ARK_BAD_NVECTOR);
      return (ARK_ILL_INPUT);
    }

    /* Set space requirements for one N_Vector */
    if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
    else
    {
      lrw1 = 0;
      liw1 = 0;
    }
    ark_mem->lrw1 = lrw1;
    ark_mem->liw1 = liw1;

    /* Allocate the solver vectors (using y0 as a template) */
    allocOK = arkAllocVectors(ark_mem, y0);
    if (!allocOK)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_MEM_FAIL);
      return (ARK_MEM_FAIL);
    }

    /* All allocations are complete */
    ark_mem->MallocDone = SUNTRUE;
  }

  /* All allocation and error checking is complete at this point */

  /* Copy the input parameters into ARKODE state */
  ark_mem->tcur = t0;
  ark_mem->tn   = t0;

  /* Initialize yn */
  N_VScale(ONE, y0, ark_mem->yn);
  ark_mem->fn_is_current = SUNFALSE;

  /* Clear any previous 'tstop' */
  ark_mem->tstopset = SUNFALSE;

  /* Initializations on (re-)initialization call, skip on reset */
  if (init_type == FIRST_INIT)
  {
    /* Counters */
    ark_mem->nst_attempts = 0;
    ark_mem->nst          = 0;
    ark_mem->nhnil        = 0;
    ark_mem->ncfn         = 0;
    ark_mem->netf         = 0;
    ark_mem->nconstrfails = 0;

    /* Initial, old, and next step sizes */
    ark_mem->h0u    = ZERO;
    ark_mem->hold   = ZERO;
    ark_mem->next_h = ZERO;

    /* Tolerance scale factor */
    ark_mem->tolsf = ONE;

    /* Reset error controller object */
    retval = SUNAdaptController_Reset(ark_mem->hadapt_mem->hcontroller);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__, __FILE__,
                      "Unable to reset error controller object");
      return (ARK_CONTROLLER_ERR);
    }

    /* Adaptivity counters */
    ark_mem->hadapt_mem->nst_acc = 0;
    ark_mem->hadapt_mem->nst_exp = 0;

    /* Indicate that calling the full RHS function is not required, this flag is
       updated to SUNTRUE by the interpolation module initialization function
       and/or the stepper initialization function in arkInitialSetup */
    ark_mem->call_fullrhs = SUNFALSE;

    /* Indicate that initialization has not been done before */
    ark_mem->initialized = SUNFALSE;
  }

  /* Indicate initialization is needed */
  ark_mem->initsetup  = SUNTRUE;
  ark_mem->init_type  = init_type;
  ark_mem->firststage = SUNTRUE;

  return (ARK_SUCCESS);
}